

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

_Bool parse_solver_param_val(TypedParam *out,char *val,ParamType type)

{
  _Bool _Var1;
  TypedParam *pTVar2;
  TypedParam local;
  TypedParam local_18;
  
  local_18.count = 0;
  local_18.type = TYPED_PARAM_DOUBLE;
  local_18.field_2.dval = 0.0;
  switch(type) {
  case TYPED_PARAM_DOUBLE:
    pTVar2 = &local_18;
    if (out != (TypedParam *)0x0) {
      pTVar2 = out;
    }
    _Var1 = str_to_double(val,&(pTVar2->field_2).dval);
    break;
  case TYPED_PARAM_FLOAT:
    pTVar2 = &local_18;
    if (out != (TypedParam *)0x0) {
      pTVar2 = out;
    }
    _Var1 = str_to_float(val,&(pTVar2->field_2).fval);
    break;
  case TYPED_PARAM_BOOL:
    pTVar2 = &local_18;
    if (out != (TypedParam *)0x0) {
      pTVar2 = out;
    }
    _Var1 = str_to_bool(val,&(pTVar2->field_2).bval);
    break;
  case TYPED_PARAM_INT32:
    pTVar2 = &local_18;
    if (out != (TypedParam *)0x0) {
      pTVar2 = out;
    }
    _Var1 = str_to_int32(val,&(pTVar2->field_2).ival);
    break;
  case TYPED_PARAM_USIZE:
    pTVar2 = &local_18;
    if (out != (TypedParam *)0x0) {
      pTVar2 = out;
    }
    _Var1 = str_to_usize(val,&(pTVar2->field_2).sizeval);
    break;
  case TYPED_PARAM_STR:
    pTVar2 = &local_18;
    if (out != (TypedParam *)0x0) {
      pTVar2 = out;
    }
    (pTVar2->field_2).sval = val;
    _Var1 = true;
    break;
  default:
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool parse_solver_param_val(TypedParam *out, const char *val, ParamType type) {
    TypedParam local = {0};
    if (out == NULL) {
        out = &local;
    }

    bool parse_success = false;

    switch (type) {
    case TYPED_PARAM_STR:
        out->sval = val;
        parse_success = true;
        break;
    case TYPED_PARAM_BOOL:
        parse_success = str_to_bool(val, &out->bval);
        break;
    case TYPED_PARAM_INT32:
        parse_success = str_to_int32(val, &out->ival);
        break;
    case TYPED_PARAM_USIZE:
        parse_success = str_to_usize(val, &out->sizeval);
        break;
    case TYPED_PARAM_DOUBLE:
        parse_success = str_to_double(val, &out->dval);
        break;
    case TYPED_PARAM_FLOAT:
        parse_success = str_to_float(val, &out->fval);
        break;
    }

    return parse_success;
}